

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O1

string_view __thiscall
absl::lts_20240722::StripLeadingAsciiWhitespace(lts_20240722 *this,string_view str)

{
  byte *pbVar1;
  byte *pbVar2;
  lts_20240722 *plVar3;
  byte *pbVar4;
  long lVar5;
  string_view sVar6;
  
  pbVar4 = (byte *)str._M_len;
  pbVar1 = pbVar4;
  if (0 < (long)this >> 2) {
    pbVar1 = pbVar4 + ((ulong)this & 0xfffffffffffffffc);
    lVar5 = ((long)this >> 2) + 1;
    pbVar2 = pbVar4 + 3;
    do {
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)pbVar2[-3]) & 8) == 0) {
        pbVar2 = pbVar2 + -3;
        goto LAB_002db81d;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)pbVar2[-2]) & 8) == 0) {
        pbVar2 = pbVar2 + -2;
        goto LAB_002db81d;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)pbVar2[-1]) & 8) == 0) {
        pbVar2 = pbVar2 + -1;
        goto LAB_002db81d;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)*pbVar2) & 8) == 0)
      goto LAB_002db81d;
      lVar5 = lVar5 + -1;
      pbVar2 = pbVar2 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)(pbVar4 + (long)this) - (long)pbVar1;
  if (lVar5 == 1) {
LAB_002db806:
    pbVar2 = pbVar1;
    if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)*pbVar1) & 8) == 0)
    goto LAB_002db81d;
  }
  else {
    if (lVar5 == 2) {
LAB_002db7dc:
      pbVar2 = pbVar1;
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)*pbVar1) & 8) == 0)
      goto LAB_002db81d;
      pbVar1 = pbVar1 + 1;
      goto LAB_002db806;
    }
    if (lVar5 == 3) {
      pbVar2 = pbVar1;
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)*pbVar1) & 8) == 0)
      goto LAB_002db81d;
      pbVar1 = pbVar1 + 1;
      goto LAB_002db7dc;
    }
  }
  pbVar2 = pbVar4 + (long)this;
LAB_002db81d:
  plVar3 = (lts_20240722 *)(pbVar2 + -(long)pbVar4);
  sVar6._M_len = (long)this - (long)plVar3;
  if (this < plVar3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  sVar6._M_str = (char *)(pbVar4 + (long)plVar3);
  return sVar6;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripLeadingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.begin(), str.end(), absl::ascii_isspace);
  return str.substr(static_cast<size_t>(it - str.begin()));
}